

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTBoard.cpp
# Opt level: O2

void __thiscall TTTBoard::DrawBoard(TTTBoard *this)

{
  CellType CVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  ostream *poVar5;
  char cVar6;
  
  CVar1 = this->m_board[0][0];
  cVar6 = 'O';
  cVar2 = ' ';
  cVar3 = cVar2;
  if (CVar1 == OHS) {
    cVar3 = cVar6;
  }
  cVar4 = 'X';
  if (CVar1 == EXXES) {
    cVar3 = cVar4;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,cVar3);
  poVar5 = std::operator<<(poVar5,"|");
  CVar1 = this->m_board[0][1];
  cVar3 = cVar2;
  if (CVar1 == OHS) {
    cVar3 = cVar6;
  }
  if (CVar1 == EXXES) {
    cVar3 = cVar4;
  }
  poVar5 = std::operator<<(poVar5,cVar3);
  poVar5 = std::operator<<(poVar5,"|");
  CVar1 = this->m_board[0][2];
  cVar3 = cVar2;
  if (CVar1 == OHS) {
    cVar3 = cVar6;
  }
  if (CVar1 == EXXES) {
    cVar3 = cVar4;
  }
  poVar5 = std::operator<<(poVar5,cVar3);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"-----");
  std::endl<char,std::char_traits<char>>(poVar5);
  CVar1 = this->m_board[1][0];
  cVar3 = cVar2;
  if (CVar1 == OHS) {
    cVar3 = cVar6;
  }
  if (CVar1 == EXXES) {
    cVar3 = cVar4;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,cVar3);
  poVar5 = std::operator<<(poVar5,"|");
  CVar1 = this->m_board[1][1];
  cVar3 = cVar2;
  if (CVar1 == OHS) {
    cVar3 = cVar6;
  }
  cVar4 = 'X';
  if (CVar1 == EXXES) {
    cVar3 = cVar4;
  }
  poVar5 = std::operator<<(poVar5,cVar3);
  poVar5 = std::operator<<(poVar5,"|");
  CVar1 = this->m_board[1][2];
  cVar3 = cVar2;
  if (CVar1 == OHS) {
    cVar3 = cVar6;
  }
  if (CVar1 == EXXES) {
    cVar3 = cVar4;
  }
  poVar5 = std::operator<<(poVar5,cVar3);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"-----");
  std::endl<char,std::char_traits<char>>(poVar5);
  CVar1 = this->m_board[2][0];
  cVar3 = cVar2;
  if (CVar1 == OHS) {
    cVar3 = cVar6;
  }
  if (CVar1 == EXXES) {
    cVar3 = cVar4;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,cVar3);
  poVar5 = std::operator<<(poVar5,"|");
  CVar1 = this->m_board[2][1];
  if (CVar1 == OHS) {
    cVar2 = cVar6;
  }
  if (CVar1 == EXXES) {
    cVar2 = cVar4;
  }
  poVar5 = std::operator<<(poVar5,cVar2);
  poVar5 = std::operator<<(poVar5,"|");
  CVar1 = this->m_board[2][2];
  cVar6 = ' ';
  if (CVar1 == OHS) {
    cVar6 = 'O';
  }
  if (CVar1 == EXXES) {
    cVar6 = 'X';
  }
  poVar5 = std::operator<<(poVar5,cVar6);
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void TTTBoard::DrawBoard() const
{
    cout << PrintCell(m_board[0][0]) << "|"
         << PrintCell(m_board[0][1]) << "|"
         << PrintCell(m_board[0][2]) << endl;

    cout << "-----" << endl;

    cout << PrintCell(m_board[1][0]) << "|"
         << PrintCell(m_board[1][1]) << "|"
         << PrintCell(m_board[1][2]) << endl;

    cout << "-----" << endl;

    cout << PrintCell(m_board[2][0]) << "|"
         << PrintCell(m_board[2][1]) << "|"
         << PrintCell(m_board[2][2]) << endl;
}